

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::F_formatter<spdlog::details::scoped_padder>::format
          (F_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_3,
          memory_buf_t *dest)

{
  memory_buf_t *in_RDI;
  scoped_padder p;
  size_t field_size;
  duration<long,_std::ratio<1L,_1000000000L>_> ns;
  scoped_padder *in_stack_ffffffffffffff90;
  memory_buf_t *in_stack_ffffffffffffff98;
  padding_info *in_stack_ffffffffffffffa0;
  time_point in_stack_ffffffffffffffa8;
  scoped_padder *in_stack_ffffffffffffffb0;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28 [5];
  
  local_28[0].__r =
       (rep)fmt_helper::time_fraction<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                      (in_stack_ffffffffffffffa8);
  scoped_padder::scoped_padder
            (in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8.__d.__r,
             in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  Catch::clara::std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(local_28);
  fmt_helper::pad9<unsigned_long>((unsigned_long)in_stack_ffffffffffffff90,in_RDI);
  scoped_padder::~scoped_padder(in_stack_ffffffffffffff90);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        auto ns = fmt_helper::time_fraction<std::chrono::nanoseconds>(msg.time);
        const size_t field_size = 9;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad9(static_cast<size_t>(ns.count()), dest);
    }